

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O2

CURLcode curl_easy_perform(Curl_easy *data)

{
  uint uVar1;
  bool bVar2;
  CURLMcode CVar3;
  Curl_multi *multi;
  time_t tVar4;
  CURLMsg *pCVar5;
  CURLcode CVar6;
  ulong uVar7;
  int timeout_ms;
  timeval older;
  timeval newer;
  CURLcode local_ec;
  int still_running;
  int local_e4;
  ulong local_e0;
  Curl_easy *local_d8;
  sigpipe_ignore pipe_st;
  
  if (data == (Curl_easy *)0x0) {
    CVar6 = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else if (data->multi == (Curl_multi *)0x0) {
    multi = data->multi_easy;
    if (multi == (Curl_multi *)0x0) {
      multi = Curl_multi_handle(1,3);
      if (multi == (Curl_multi *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      data->multi_easy = multi;
    }
    curl_multi_setopt(multi,CURLMOPT_MAXCONNECTS,(data->set).maxconnects);
    CVar3 = curl_multi_add_handle(multi,data);
    if (CVar3 == CURLM_OK) {
      local_e0 = 0;
      sigpipe_ignore(data,&pipe_st);
      data->multi = multi;
      local_ec = CURLE_OK;
      CVar3 = CURLM_OK;
      local_d8 = data;
      do {
        bVar2 = false;
        while( true ) {
          if ((CVar3 != CURLM_OK) || (bVar2)) {
            if (CVar3 != CURLM_OK) {
              local_ec = (uint)(CVar3 != CURLM_OUT_OF_MEMORY) * 0x10 + CURLE_OUT_OF_MEMORY;
            }
            curl_multi_remove_handle(multi,local_d8);
            sigpipe_restore(&pipe_st);
            return local_ec;
          }
          still_running = 0;
          older = curlx_tvnow();
          CVar3 = curl_multi_wait(multi,(curl_waitfd *)0x0,0,1000,&local_e4);
          if (CVar3 == CURLM_OK) {
            uVar7 = 0;
            if (local_e4 == 0) {
              newer = curlx_tvnow();
              tVar4 = curlx_tvdiff(newer,older);
              if (tVar4 < 0xb) {
                uVar1 = (uint)local_e0;
                uVar7 = (ulong)(uVar1 + 1);
                if (1 < (int)uVar1) {
                  timeout_ms = 1 << ((byte)local_e0 & 0x1f);
                  if (8 < uVar1) {
                    timeout_ms = 1000;
                  }
                  Curl_wait_ms(timeout_ms);
                }
              }
            }
            CVar3 = curl_multi_perform(multi,&still_running);
            local_e0 = uVar7;
          }
          if ((still_running != 0 || CVar3 != CURLM_OK) ||
             (pCVar5 = curl_multi_info_read(multi,&local_e4), pCVar5 == (CURLMsg *)0x0)) break;
          local_ec = (pCVar5->data).result;
          bVar2 = true;
        }
      } while( true );
    }
    curl_multi_cleanup(multi);
    CVar6 = CURLE_OUT_OF_MEMORY;
    if (CVar3 != CURLM_OUT_OF_MEMORY) {
      CVar6 = CURLE_FAILED_INIT;
    }
  }
  else {
    Curl_failf(data,"easy handle already used in multi handle");
    CVar6 = CURLE_FAILED_INIT;
  }
  return CVar6;
}

Assistant:

static CURLcode easy_perform(struct Curl_easy *data, bool events)
{
  struct Curl_multi *multi;
  CURLMcode mcode;
  CURLcode result = CURLE_OK;
  SIGPIPE_VARIABLE(pipe_st);

  if(!data)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  if(data->multi) {
    failf(data, "easy handle already used in multi handle");
    return CURLE_FAILED_INIT;
  }

  if(data->multi_easy)
    multi = data->multi_easy;
  else {
    /* this multi handle will only ever have a single easy handled attached
       to it, so make it use minimal hashes */
    multi = Curl_multi_handle(1, 3);
    if(!multi)
      return CURLE_OUT_OF_MEMORY;
    data->multi_easy = multi;
  }

  /* Copy the MAXCONNECTS option to the multi handle */
  curl_multi_setopt(multi, CURLMOPT_MAXCONNECTS, data->set.maxconnects);

  mcode = curl_multi_add_handle(multi, data);
  if(mcode) {
    curl_multi_cleanup(multi);
    if(mcode == CURLM_OUT_OF_MEMORY)
      return CURLE_OUT_OF_MEMORY;
    return CURLE_FAILED_INIT;
  }

  sigpipe_ignore(data, &pipe_st);

  /* assign this after curl_multi_add_handle() since that function checks for
     it and rejects this handle otherwise */
  data->multi = multi;

  /* run the transfer */
  result = events ? easy_events(multi) : easy_transfer(multi);

  /* ignoring the return code isn't nice, but atm we can't really handle
     a failure here, room for future improvement! */
  (void)curl_multi_remove_handle(multi, data);

  sigpipe_restore(&pipe_st);

  /* The multi handle is kept alive, owned by the easy handle */
  return result;
}